

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcessPrivate::Channel::clear(Channel *this)

{
  int iVar1;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = (int)*(char *)(in_RDI + 0x30);
  if (iVar1 == 1) {
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + 0x1b8) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x1a0) = 0;
  }
  else if (iVar1 == 2) {
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + 0x1f0) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x1d8) = 0;
  }
  *(undefined1 *)(in_RDI + 0x30) = 0;
  QString::clear((QString *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x18) = 0;
  return;
}

Assistant:

void QProcessPrivate::Channel::clear()
{
    switch (type) {
    case PipeSource:
        Q_ASSERT(process);
        process->stdinChannel.type = Normal;
        process->stdinChannel.process = nullptr;
        break;
    case PipeSink:
        Q_ASSERT(process);
        process->stdoutChannel.type = Normal;
        process->stdoutChannel.process = nullptr;
        break;
    default:
        break;
    }

    type = Normal;
    file.clear();
    process = nullptr;
}